

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassJacobian
          (KinDynComputations *this,MatrixDynSize *comJacobian)

{
  pointer peVar1;
  index_type iVar2;
  bool bVar3;
  MatrixView<double> local_50;
  
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)comJacobian,3);
  peVar1 = (pointer)iDynTree::MatrixDynSize::data();
  iVar2 = iDynTree::MatrixDynSize::rows();
  local_50.m_cols = iDynTree::MatrixDynSize::cols();
  local_50.m_storageOrder = RowMajor;
  local_50.m_innerStride = 1;
  local_50.m_storage = peVar1;
  local_50.m_rows = iVar2;
  local_50.m_outerStride = local_50.m_cols;
  bVar3 = getCenterOfMassJacobian(this,&local_50);
  return bVar3;
}

Assistant:

bool KinDynComputations::getCenterOfMassJacobian(MatrixDynSize& comJacobian)
{
    comJacobian.resize(3,pimpl->m_robot_model.getNrOfDOFs()+6);

    return this->getCenterOfMassJacobian(MatrixView<double>(comJacobian));
}